

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool mkvparser::PrimaryChromaticity::Parse
               (IMkvReader *reader,longlong read_pos,longlong value_size,bool is_x,
               PrimaryChromaticity **chromaticity)

{
  double *size_;
  PrimaryChromaticity *this;
  long lVar1;
  byte in_CL;
  long in_RDI;
  long *in_R8;
  longlong parse_status;
  double parser_value;
  float *value;
  PrimaryChromaticity *pc;
  undefined8 local_70;
  longlong in_stack_ffffffffffffffc0;
  IMkvReader *in_stack_ffffffffffffffc8;
  undefined1 local_1;
  
  if (in_RDI == 0) {
    local_1 = false;
  }
  else {
    if (*in_R8 == 0) {
      this = (PrimaryChromaticity *)operator_new(8);
      PrimaryChromaticity(this);
      *in_R8 = (long)this;
    }
    if (*in_R8 == 0) {
      local_1 = false;
    }
    else {
      size_ = (double *)*in_R8;
      local_70 = size_;
      if ((in_CL & 1) == 0) {
        local_70 = (double *)((long)size_ + 4);
      }
      lVar1 = UnserializeFloat(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,(longlong)size_,
                               local_70);
      if (lVar1 < 0) {
        local_1 = false;
      }
      else {
        *(undefined4 *)local_70 = 0;
        local_1 = true;
      }
    }
  }
  return local_1;
}

Assistant:

bool PrimaryChromaticity::Parse(IMkvReader* reader, long long read_pos,
                                long long value_size, bool is_x,
                                PrimaryChromaticity** chromaticity) {
  if (!reader)
    return false;

  if (!*chromaticity)
    *chromaticity = new PrimaryChromaticity();

  if (!*chromaticity)
    return false;

  PrimaryChromaticity* pc = *chromaticity;
  float* value = is_x ? &pc->x : &pc->y;

  double parser_value = 0;
  const long long parse_status =
      UnserializeFloat(reader, read_pos, value_size, parser_value);

  // Valid range is [0, 1]. Make sure the double is representable as a float
  // before casting.
  if (parse_status < 0 || parser_value < 0.0 || parser_value > 1.0 ||
      (parser_value > 0.0 && parser_value < FLT_MIN))
    return false;

  *value = static_cast<float>(parser_value);

  return true;
}